

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

void __thiscall llvm::DWARFUnit::updateAddressDieMap(DWARFUnit *this,DWARFDie Die)

{
  DWARFAddressRange *__k;
  DWARFAddressRange *pDVar1;
  uint64_t uVar2;
  DWARFDebugInfoEntry *pDVar3;
  undefined1 auVar4 [8];
  DWARFUnit *pDVar5;
  bool bVar6;
  storage_type *psVar7;
  iterator iVar8;
  long lVar9;
  mapped_type *pmVar10;
  uint64_t *__k_00;
  ulong uVar11;
  DWARFDie Die_00;
  undefined1 auStack_78 [8];
  DWARFDie Die_local;
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  DIERangesOrError;
  Error local_40 [2];
  
  Die_local.U = (DWARFUnit *)Die.Die;
  auStack_78 = (undefined1  [8])Die.U;
  bVar6 = DWARFDie::isSubroutineDIE((DWARFDie *)auStack_78);
  if (bVar6) {
    DWARFDie::getAddressRanges
              ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)&Die_local.Die,(DWARFDie *)auStack_78);
    if ((DIERangesOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
      psVar7 = Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               ::getStorage((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                             *)&Die_local.Die);
      pDVar1 = (psVar7->
               super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_40[1].Payload = (ErrorInfoBase *)&this->AddrDieMap;
      for (__k_00 = &((psVar7->
                      super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                      )._M_impl.super__Vector_impl_data._M_start)->HighPC;
          __k = (DWARFAddressRange *)(__k_00 + -1), __k != pDVar1; __k_00 = __k_00 + 3) {
        if (((DWARFAddressRange *)(__k_00 + -1))->LowPC != *__k_00) {
          iVar8 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                  ::upper_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                                 *)local_40[1].Payload,(key_type_conflict *)__k);
          if (iVar8._M_node !=
              (this->AddrDieMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
            uVar11 = __k->LowPC;
            lVar9 = std::_Rb_tree_decrement(iVar8._M_node);
            if (uVar11 < *(ulong *)(lVar9 + 0x28)) {
              if (*__k_00 < *(ulong *)(lVar9 + 0x28)) {
                pmVar10 = std::
                          map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                          ::operator[]((map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                                        *)local_40[1].Payload,__k_00);
                pmVar10->first = *(unsigned_long *)(lVar9 + 0x28);
                pDVar3 = *(DWARFDebugInfoEntry **)(lVar9 + 0x38);
                (pmVar10->second).U = *(DWARFUnit **)(lVar9 + 0x30);
                (pmVar10->second).Die = pDVar3;
                uVar11 = __k->LowPC;
              }
              if (*(key_type_conflict *)(lVar9 + 0x20) < uVar11) {
                pmVar10 = std::
                          map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                          ::operator[]((map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                                        *)local_40[1].Payload,(key_type_conflict *)(lVar9 + 0x20));
                pmVar10->first = uVar11;
              }
            }
          }
          pDVar5 = Die_local.U;
          auVar4 = auStack_78;
          uVar2 = *__k_00;
          pmVar10 = std::
                    map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                    ::operator[]((map<unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_llvm::DWARFDie>_>_>_>
                                  *)local_40[1].Payload,(key_type_conflict *)__k);
          pmVar10->first = uVar2;
          (pmVar10->second).U = (DWARFUnit *)auVar4;
          (pmVar10->second).Die = (DWARFDebugInfoEntry *)pDVar5;
        }
      }
    }
    else {
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                 *)local_40);
      consumeError(local_40);
      if ((long *)((ulong)local_40[0].Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_40[0].Payload & 0xfffffffffffffffe) + 8))();
      }
    }
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)&Die_local.Die);
  }
  Die_00 = DWARFDie::getFirstChild((DWARFDie *)auStack_78);
  Die_local.Die = (DWARFDebugInfoEntry *)Die_00.U;
  while( true ) {
    if ((Die_00.U == (DWARFUnit *)0x0) || (Die_00.Die == (DWARFDebugInfoEntry *)0x0)) break;
    updateAddressDieMap(this,Die_00);
    Die_00 = DWARFDie::getSibling((DWARFDie *)&Die_local.Die);
    Die_local.Die = (DWARFDebugInfoEntry *)Die_00.U;
  }
  return;
}

Assistant:

void DWARFUnit::updateAddressDieMap(DWARFDie Die) {
  if (Die.isSubroutineDIE()) {
    auto DIERangesOrError = Die.getAddressRanges();
    if (DIERangesOrError) {
      for (const auto &R : DIERangesOrError.get()) {
        // Ignore 0-sized ranges.
        if (R.LowPC == R.HighPC)
          continue;
        auto B = AddrDieMap.upper_bound(R.LowPC);
        if (B != AddrDieMap.begin() && R.LowPC < (--B)->second.first) {
          // The range is a sub-range of existing ranges, we need to split the
          // existing range.
          if (R.HighPC < B->second.first)
            AddrDieMap[R.HighPC] = B->second;
          if (R.LowPC > B->first)
            AddrDieMap[B->first].first = R.LowPC;
        }
        AddrDieMap[R.LowPC] = std::make_pair(R.HighPC, Die);
      }
    } else
      llvm::consumeError(DIERangesOrError.takeError());
  }
  // Parent DIEs are added to the AddrDieMap prior to the Children DIEs to
  // simplify the logic to update AddrDieMap. The child's range will always
  // be equal or smaller than the parent's range. With this assumption, when
  // adding one range into the map, it will at most split a range into 3
  // sub-ranges.
  for (DWARFDie Child = Die.getFirstChild(); Child; Child = Child.getSibling())
    updateAddressDieMap(Child);
}